

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::AddReloc(BinaryWriter *this,RelocType reloc_type,Index index)

{
  undefined8 *puVar1;
  Index IVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  char *pcVar6;
  ulong uVar7;
  RelocSection *pRVar8;
  pointer pRVar9;
  pointer puVar10;
  ulong uVar11;
  pointer puVar12;
  ulong uVar13;
  long lVar14;
  RelocSection *pRVar15;
  Index symbol_index;
  size_t offset;
  Index local_48;
  RelocType local_44;
  char *local_40;
  unsigned_long local_38;
  
  pRVar15 = this->current_reloc_section_;
  local_44 = reloc_type;
  if ((pRVar15 == (RelocSection *)0x0) || (pRVar15->section_index != this->section_count_)) {
    pcVar6 = GetSectionName(this->last_section_type_);
    pRVar3 = (this->reloc_sections_).
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar3 == (this->reloc_sections_).
                  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pRVar4 = (this->reloc_sections_).
               super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = (long)pRVar3 - (long)pRVar4;
      local_40 = pcVar6;
      if (lVar14 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar11 = (lVar14 >> 3) * -0x3333333333333333;
      uVar7 = 1;
      if (pRVar3 != pRVar4) {
        uVar7 = uVar11;
      }
      uVar13 = uVar7 + uVar11;
      if (0x333333333333332 < uVar13) {
        uVar13 = 0x333333333333333;
      }
      if (CARRY8(uVar7,uVar11)) {
        uVar13 = 0x333333333333333;
      }
      pRVar8 = (RelocSection *)operator_new(uVar13 * 0x28);
      IVar2 = this->section_count_;
      *(char **)((long)pRVar8 + lVar14) = local_40;
      *(Index *)((long)pRVar8 + lVar14 + 8) = IVar2;
      puVar1 = (undefined8 *)((long)pRVar8 + lVar14 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pRVar8 + lVar14 + 0x20) = 0;
      pRVar15 = pRVar8;
      for (pRVar9 = pRVar4; pRVar3 != pRVar9; pRVar9 = pRVar9 + 1) {
        pRVar15->section_index = pRVar9->section_index;
        pRVar15->name = pRVar9->name;
        pRVar5 = (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (pRVar15->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (pRVar15->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_finish = pRVar5;
        (pRVar15->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pRVar15 = pRVar15 + 1;
      }
      if (pRVar4 != (pointer)0x0) {
        operator_delete(pRVar4,(long)(this->reloc_sections_).
                                     super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pRVar4);
      }
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar8;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar15 + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar8 + uVar13;
    }
    else {
      IVar2 = this->section_count_;
      pRVar3->name = pcVar6;
      pRVar3->section_index = IVar2;
      (pRVar3->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar3->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pRVar3->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar15 = (this->reloc_sections_).
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar15 + 1;
    }
    this->current_reloc_section_ = pRVar15;
  }
  local_38 = this->stream_->offset_ - this->last_section_payload_offset_;
  if ((int)reloc_type < 7) {
    if (reloc_type != First) {
      if (reloc_type != TypeIndexLEB) {
LAB_001528ee:
        _GLOBAL__N_1::BinaryWriter::AddReloc((BinaryWriter *)(ulong)reloc_type);
        return;
      }
      goto LAB_001528b9;
    }
    puVar10 = (this->symtab_).functions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar12 = (this->symtab_).functions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else if (reloc_type == GlobalIndexLEB) {
    puVar10 = (this->symtab_).globals_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar12 = (this->symtab_).globals_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    if (reloc_type != TableNumberLEB) goto LAB_001528ee;
    puVar10 = (this->symtab_).tables_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar12 = (this->symtab_).tables_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if ((ulong)((long)puVar12 - (long)puVar10 >> 2) <= (ulong)index) {
    return;
  }
  index = puVar10[index];
LAB_001528b9:
  if (index != 0xffffffff) {
    local_48 = index;
    std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
    emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
              ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)&pRVar15->relocations,&local_44,
               &local_38,&local_48);
  }
  return;
}

Assistant:

void BinaryWriter::AddReloc(RelocType reloc_type, Index index) {
  // Add a new reloc section if needed
  if (!current_reloc_section_ ||
      current_reloc_section_->section_index != section_count_) {
    reloc_sections_.emplace_back(GetSectionName(last_section_type_),
                                 section_count_);
    current_reloc_section_ = &reloc_sections_.back();
  }

  // Add a new relocation to the curent reloc section
  size_t offset = stream_->offset() - last_section_payload_offset_;
  Index symbol_index = GetSymbolIndex(reloc_type, index);
  if (symbol_index == kInvalidIndex) {
    // The file is invalid, for example a reference to function 42 where only 10
    // functions are defined.  The user must have already passed --no-check, so
    // no extra warning here is needed.
    return;
  }
  current_reloc_section_->relocations.emplace_back(reloc_type, offset,
                                                   symbol_index);
}